

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::IsInPackage
          (DescriptorBuilder *this,FileDescriptor *file,string *package_name)

{
  bool bVar1;
  
  bVar1 = HasPrefixString(*(string **)(file + 8),package_name);
  if (bVar1) {
    bVar1 = true;
    if ((*(long **)(file + 8))[1] != package_name->_M_string_length) {
      bVar1 = *(char *)(**(long **)(file + 8) + package_name->_M_string_length) == '.';
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DescriptorBuilder::IsInPackage(const FileDescriptor* file,
                                    const std::string& package_name) {
  return HasPrefixString(file->package(), package_name) &&
         (file->package().size() == package_name.size() ||
          file->package()[package_name.size()] == '.');
}